

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeMessageNoTable(MessageLite *msg,ArrayOutput *output)

{
  int iVar1;
  long *in_RSI;
  CodedOutputStream o;
  ArrayOutputStream array_stream;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  CodedOutputStream *output_00;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  void *in_stack_ffffffffffffff78;
  ArrayOutputStream *in_stack_ffffffffffffff80;
  undefined1 local_30 [48];
  
  output_00 = (CodedOutputStream *)local_30;
  local_30._32_8_ = in_RSI;
  io::ArrayOutputStream::ArrayOutputStream
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             in_stack_ffffffffffffff70);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (ZeroCopyOutputStream *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  io::CodedOutputStream::SetSerializationDeterministic
            ((CodedOutputStream *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (bool)in_stack_ffffffffffffff5f);
  MessageLite::SerializeWithCachedSizes
            ((MessageLite *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),output_00)
  ;
  iVar1 = io::CodedOutputStream::ByteCount
                    ((CodedOutputStream *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  *(long *)local_30._32_8_ = *(long *)local_30._32_8_ + (long)iVar1;
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)0x3d8f8d);
  io::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)0x3d8f97);
  return;
}

Assistant:

void SerializeMessageNoTable(const MessageLite* msg, ArrayOutput* output) {
  io::ArrayOutputStream array_stream(output->ptr, INT_MAX);
  io::CodedOutputStream o(&array_stream);
  o.SetSerializationDeterministic(output->is_deterministic);
  msg->SerializeWithCachedSizes(&o);
  output->ptr += o.ByteCount();
}